

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

void tree_sitter_c_sharp_external_scanner_deserialize(void *payload,char *buffer,uint length)

{
  uint uVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  long lVar5;
  uint uVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  
  *(undefined1 *)payload = 0;
  *(undefined4 *)((long)payload + 0x10) = 0;
  if (length == 0) {
    uVar6 = 0;
  }
  else {
    *(char *)payload = *buffer;
    bVar2 = buffer[1];
    *(uint *)((long)payload + 0x10) = (uint)bVar2;
    if (*(uint *)((long)payload + 0x14) < (uint)bVar2) {
      if (*(void **)((long)payload + 8) == (void *)0x0) {
        pvVar7 = malloc((ulong)((uint)bVar2 * 8));
      }
      else {
        pvVar7 = realloc(*(void **)((long)payload + 8),(ulong)((uint)bVar2 * 8));
      }
      *(void **)((long)payload + 8) = pvVar7;
      *(uint *)((long)payload + 0x14) = (uint)bVar2;
    }
    if (*(int *)((long)payload + 0x10) == 0) {
      uVar6 = 2;
    }
    else {
      uVar6 = 2;
      uVar8 = 0;
      do {
        uVar9 = (ulong)uVar6;
        cVar3 = buffer[uVar6 + 1];
        uVar1 = uVar6 + 3;
        cVar4 = buffer[uVar6 + 2];
        uVar6 = uVar6 + 4;
        bVar2 = buffer[uVar1];
        lVar5 = *(long *)((long)payload + 8);
        *(char *)(lVar5 + uVar8 * 8) = buffer[uVar9];
        *(char *)(lVar5 + 1 + uVar8 * 8) = cVar3;
        *(char *)(lVar5 + 2 + uVar8 * 8) = cVar4;
        *(undefined1 *)(lVar5 + 3 + uVar8 * 8) = 0;
        *(uint *)(lVar5 + 4 + uVar8 * 8) = (uint)bVar2;
        uVar8 = uVar8 + 1;
      } while (uVar8 < *(uint *)((long)payload + 0x10));
    }
  }
  if (uVar6 != length) {
    __assert_fail("size == length",
                  "/workspace/llm4binary/github/license_c_cmakelists/tree-sitter[P]tree-sitter-c-sharp/src/scanner.c"
                  ,0x6b,
                  "void tree_sitter_c_sharp_external_scanner_deserialize(void *, const char *, unsigned int)"
                 );
  }
  return;
}

Assistant:

void tree_sitter_c_sharp_external_scanner_deserialize(void *payload, const char *buffer, unsigned length) {
    Scanner *scanner = (Scanner *)payload;

    scanner->quote_count = 0;
    array_clear(&scanner->interpolation_stack);
    unsigned size = 0;

    if (length > 0) {
        scanner->quote_count = (unsigned char)buffer[size++];
        scanner->interpolation_stack.size = (unsigned char)buffer[size++];
        array_reserve(&scanner->interpolation_stack, scanner->interpolation_stack.size);

        for (unsigned i = 0; i < scanner->interpolation_stack.size; i++) {
            Interpolation interpolation = {0};
            interpolation.dollar_count = buffer[size++];
            interpolation.open_brace_count = buffer[size++];
            interpolation.quote_count = buffer[size++];
            interpolation.string_type = (unsigned char)buffer[size++];
            scanner->interpolation_stack.contents[i] = interpolation;
        }
    }

    assert(size == length);
}